

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwbase.h
# Opt level: O1

float32 __thiscall rw::Matrix::normalError(Matrix *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = (float)(this->right).x;
  fVar1 = (float)(this->right).y;
  fVar2 = (float)(this->right).z;
  fVar4 = fVar2 * fVar2 + fVar3 * fVar3 + fVar1 * fVar1 + -1.0;
  fVar3 = (float)(this->up).x;
  fVar1 = (float)(this->up).y;
  fVar2 = (float)(this->up).z;
  fVar5 = fVar2 * fVar2 + fVar3 * fVar3 + fVar1 * fVar1 + -1.0;
  fVar3 = (float)(this->at).x;
  fVar1 = (float)(this->at).y;
  fVar2 = (float)(this->at).z;
  fVar3 = fVar2 * fVar2 + fVar3 * fVar3 + fVar1 * fVar1 + -1.0;
  return (float32)(fVar3 * fVar3 + fVar4 * fVar4 + fVar5 * fVar5);
}

Assistant:

inline float32 dot(const V3d &a, const V3d &b) { return a.x*b.x + a.y*b.y + a.z*b.z; }